

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Alloc.h
# Opt level: O2

Ref __thiscall
Minisat::RegionAllocator<unsigned_int>::alloc(RegionAllocator<unsigned_int> *this,int size)

{
  uint uVar1;
  undefined8 uVar2;
  
  capacity(this,this->sz + size);
  uVar1 = this->sz;
  this->sz = size + uVar1;
  if (!CARRY4(size,uVar1)) {
    return uVar1;
  }
  uVar2 = __cxa_allocate_exception(1);
  __cxa_throw(uVar2,&OutOfMemoryException::typeinfo,0);
}

Assistant:

typename RegionAllocator<T>::Ref RegionAllocator<T>::alloc(int size)
{
    // printf("ALLOC called (this = %p, size = %d)\n", this, size); fflush(stdout);
    assert(size > 0);
    capacity(sz + size);

    uint32_t prev_sz = sz;
    sz += size;

    // Handle overflow:
    if (sz < prev_sz) throw OutOfMemoryException();

    return prev_sz;
}